

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O0

int archive_write_open2(archive *_a,void *client_data,undefined1 *opener,
                       archive_write_callback *writer,undefined1 *closer,undefined1 *freer)

{
  int iVar1;
  archive_write_filter *paVar2;
  int local_60;
  int magic_test;
  int r1;
  int ret;
  archive_write_filter *client_filter;
  archive_write *a;
  undefined1 *freer_local;
  undefined1 *closer_local;
  archive_write_callback *writer_local;
  undefined1 *opener_local;
  void *client_data_local;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_open");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    archive_clear_error(_a);
    _a[1].error_string.s = (char *)writer;
    _a[1].error = opener;
    _a[1].error_string.length = (size_t)closer;
    _a[1].error_string.buffer_length = (size_t)freer;
    _a[1].current_code = (char *)client_data;
    paVar2 = __archive_write_allocate_filter(_a);
    if (paVar2 == (archive_write_filter *)0x0) {
      _a_local._4_4_ = -0x1e;
    }
    else {
      paVar2->open = archive_write_client_open;
      paVar2->write = archive_write_client_write;
      paVar2->close = archive_write_client_close;
      paVar2->free = archive_write_client_free;
      local_60 = __archive_write_filters_open((archive_write *)_a);
      if (local_60 < -0x14) {
        iVar1 = __archive_write_filters_close((archive_write *)_a);
        __archive_write_filters_free(_a);
        if (iVar1 < local_60) {
          local_60 = iVar1;
        }
        _a_local._4_4_ = local_60;
      }
      else {
        _a->state = 2;
        magic_test = local_60;
        if (_a[1].read_data_remaining != 0) {
          magic_test = (*(code *)_a[1].read_data_remaining)(_a);
        }
        _a_local._4_4_ = magic_test;
      }
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_open2(struct archive *_a, void *client_data,
    archive_open_callback *opener, archive_write_callback *writer,
    archive_close_callback *closer, archive_free_callback *freer)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct archive_write_filter *client_filter;
	int ret, r1;

	archive_check_magic(&a->archive, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_open");
	archive_clear_error(&a->archive);

	a->client_writer = writer;
	a->client_opener = opener;
	a->client_closer = closer;
	a->client_freer = freer;
	a->client_data = client_data;

	client_filter = __archive_write_allocate_filter(_a);

	if (client_filter == NULL)
		return (ARCHIVE_FATAL);

	client_filter->open = archive_write_client_open;
	client_filter->write = archive_write_client_write;
	client_filter->close = archive_write_client_close;
	client_filter->free = archive_write_client_free;

	ret = __archive_write_filters_open(a);
	if (ret < ARCHIVE_WARN) {
		r1 = __archive_write_filters_close(a);
		__archive_write_filters_free(_a);
		return (r1 < ret ? r1 : ret);
	}

	a->archive.state = ARCHIVE_STATE_HEADER;
	if (a->format_init)
		ret = (a->format_init)(a);
	return (ret);
}